

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# core.h
# Opt level: O0

reference<mpt::array::content> * __thiscall
mpt::reference<mpt::array::content>::operator=
          (reference<mpt::array::content> *this,reference<mpt::array::content> *ref)

{
  long lVar1;
  content *local_28;
  content *r;
  reference<mpt::array::content> *ref_local;
  reference<mpt::array::content> *this_local;
  
  local_28 = ref->_ref;
  if (local_28 != this->_ref) {
    if ((local_28 != (content *)0x0) &&
       (lVar1 = (**(code **)(*(long *)local_28 + 0x10))(), lVar1 == 0)) {
      local_28 = (content *)0x0;
    }
    if (this->_ref != (content *)0x0) {
      (**(code **)(*(long *)this->_ref + 8))();
    }
    this->_ref = local_28;
  }
  return this;
}

Assistant:

inline reference & operator= (reference const &ref)
	{
		T *r = ref._ref;
		if (r == _ref) {
			return *this;
		}
		if (r && !r->addref()) {
			r = 0;
		}
		if (_ref) _ref->unref();
		_ref = r;
		return *this;
	}